

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cluster.h
# Opt level: O0

void brotli::HistogramCombine<brotli::Histogram<704>>
               (Histogram<704> *out,uint32_t *cluster_size,uint32_t *symbols,size_t symbols_size,
               size_t max_clusters)

{
  uint32_t uVar1;
  uint idx1_00;
  uint uVar2;
  double dVar3;
  double dVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  bool bVar7;
  iterator iVar8;
  iterator __last;
  size_type sVar9;
  reference pvVar10;
  pointer puVar11;
  reference pvVar12;
  reference puVar13;
  HistogramPair *pHVar14;
  reference pvVar15;
  ulong local_130;
  size_t i_2;
  HistogramPair front;
  HistogramPair *p;
  size_t i_1;
  size_t copy_to_idx;
  const_iterator local_f0;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_e8;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_e0;
  iterator cluster;
  size_t i;
  uint32_t best_idx2;
  uint32_t best_idx1;
  size_t idx2;
  size_t idx1;
  vector<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_> pairs;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_88;
  iterator last;
  allocator<unsigned_int> local_59;
  undefined1 local_58 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> clusters;
  size_t min_cluster_size;
  double cost_diff_threshold;
  size_t max_clusters_local;
  size_t symbols_size_local;
  uint32_t *symbols_local;
  uint32_t *cluster_size_local;
  Histogram<704> *out_local;
  
  min_cluster_size = 0;
  clusters.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x1;
  std::allocator<unsigned_int>::allocator(&local_59);
  std::vector<unsigned_int,std::allocator<unsigned_int>>::vector<unsigned_int*,void>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)local_58,symbols,
             symbols + symbols_size,&local_59);
  std::allocator<unsigned_int>::~allocator(&local_59);
  iVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58);
  last = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                   ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58);
  std::
  sort<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
            ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              )iVar8._M_current,
             (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              )last._M_current);
  iVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58);
  __last = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58);
  local_88 = std::
             unique<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                       (iVar8._M_current,__last._M_current);
  pairs.super__Vector_base<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58);
  sVar9 = __gnu_cxx::operator-
                    (&local_88,
                     (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                      *)&pairs.
                         super__Vector_base<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58,sVar9);
  std::vector<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>::vector
            ((vector<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_> *)&idx1);
  for (idx2 = 0;
      sVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58),
      _best_idx2 = idx2, idx2 < sVar9; idx2 = idx2 + 1) {
    while( true ) {
      _best_idx2 = _best_idx2 + 1;
      sVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58);
      if (sVar9 <= _best_idx2) break;
      pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58,idx2);
      uVar1 = *pvVar10;
      pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58,
                           _best_idx2);
      CompareAndPushToQueue<brotli::Histogram<704>>
                (out,cluster_size,uVar1,*pvVar10,
                 (vector<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_> *)&idx1);
    }
  }
  do {
    while( true ) {
      puVar11 = (pointer)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                                   ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58)
      ;
      if (puVar11 <=
          clusters.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>::~vector
                  ((vector<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_> *)&idx1);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58);
        return;
      }
      pvVar12 = std::vector<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>::
                operator[]((vector<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_> *)
                           &idx1,0);
      if (pvVar12->cost_diff < (double)min_cluster_size) break;
      min_cluster_size = 0x547d42aea2879f2e;
      clusters.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)max_clusters;
    }
    pvVar12 = std::vector<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>::operator[]
                        ((vector<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_> *)
                         &idx1,0);
    idx1_00 = pvVar12->idx1;
    pvVar12 = std::vector<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>::operator[]
                        ((vector<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_> *)
                         &idx1,0);
    uVar2 = pvVar12->idx2;
    Histogram<704>::AddHistogram(out + idx1_00,out + uVar2);
    pvVar12 = std::vector<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>::operator[]
                        ((vector<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_> *)
                         &idx1,0);
    out[idx1_00].bit_cost_ = pvVar12->cost_combo;
    cluster_size[idx1_00] = cluster_size[uVar2] + cluster_size[idx1_00];
    for (cluster._M_current = (uint *)0x0; cluster._M_current < symbols_size;
        cluster._M_current = cluster._M_current + 1) {
      if (symbols[cluster._M_current] == uVar2) {
        symbols[cluster._M_current] = idx1_00;
      }
    }
    local_e0._M_current =
         (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58);
    while( true ) {
      local_e8._M_current =
           (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58);
      bVar7 = __gnu_cxx::operator!=(&local_e0,&local_e8);
      if (!bVar7) break;
      puVar13 = __gnu_cxx::
                __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                ::operator*(&local_e0);
      if (uVar2 <= *puVar13) {
        __gnu_cxx::
        __normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
        ::__normal_iterator<unsigned_int*>
                  ((__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
                    *)&local_f0,&local_e0);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::erase
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58,local_f0);
        break;
      }
      __gnu_cxx::
      __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
      operator++(&local_e0);
    }
    i_1 = 0;
    for (p = (HistogramPair *)0x0;
        pHVar14 = (HistogramPair *)
                  std::vector<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>::size
                            ((vector<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>
                              *)&idx1), p < pHVar14; p = (HistogramPair *)((long)&p->idx1 + 1)) {
      pvVar12 = std::vector<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>::
                operator[]((vector<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_> *)
                           &idx1,(size_type)p);
      if ((((pvVar12->idx1 != idx1_00) && (pvVar12->idx2 != idx1_00)) && (pvVar12->idx1 != uVar2))
         && (pvVar12->idx2 != uVar2)) {
        pvVar15 = std::vector<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>::front
                            ((vector<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>
                              *)&idx1);
        bVar7 = operator<(pvVar15,pvVar12);
        if (bVar7) {
          pvVar15 = std::vector<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>::
                    front((vector<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_> *)
                          &idx1);
          uVar5 = pvVar15->idx1;
          uVar6 = pvVar15->idx2;
          dVar3 = pvVar15->cost_combo;
          dVar4 = pvVar15->cost_diff;
          pvVar15 = std::vector<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>::
                    front((vector<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_> *)
                          &idx1);
          uVar1 = pvVar12->idx2;
          pvVar15->idx1 = pvVar12->idx1;
          pvVar15->idx2 = uVar1;
          pvVar15->cost_combo = pvVar12->cost_combo;
          pvVar15->cost_diff = pvVar12->cost_diff;
          pvVar12 = std::vector<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>::
                    operator[]((vector<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>
                                *)&idx1,i_1);
          pvVar12->idx1 = uVar5;
          pvVar12->idx2 = uVar6;
          pvVar12->cost_combo = dVar3;
          pvVar12->cost_diff = dVar4;
        }
        else {
          pvVar15 = std::vector<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>::
                    operator[]((vector<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>
                                *)&idx1,i_1);
          uVar1 = pvVar12->idx2;
          pvVar15->idx1 = pvVar12->idx1;
          pvVar15->idx2 = uVar1;
          pvVar15->cost_combo = pvVar12->cost_combo;
          pvVar15->cost_diff = pvVar12->cost_diff;
        }
        i_1 = i_1 + 1;
      }
    }
    std::vector<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>::resize
              ((vector<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_> *)&idx1,i_1);
    for (local_130 = 0;
        sVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58),
        local_130 < sVar9; local_130 = local_130 + 1) {
      pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58,local_130
                          );
      CompareAndPushToQueue<brotli::Histogram<704>>
                (out,cluster_size,idx1_00,*pvVar10,
                 (vector<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_> *)&idx1);
    }
  } while( true );
}

Assistant:

void HistogramCombine(HistogramType* out,
                      uint32_t* cluster_size,
                      uint32_t* symbols,
                      size_t symbols_size,
                      size_t max_clusters) {
  double cost_diff_threshold = 0.0;
  size_t min_cluster_size = 1;

  // Uniquify the list of symbols.
  std::vector<uint32_t> clusters(symbols, symbols + symbols_size);
  std::sort(clusters.begin(), clusters.end());
  std::vector<uint32_t>::iterator last =
      std::unique(clusters.begin(), clusters.end());
  clusters.resize(static_cast<size_t>(last - clusters.begin()));

  // We maintain a heap of histogram pairs, ordered by the bit cost reduction.
  std::vector<HistogramPair> pairs;
  for (size_t idx1 = 0; idx1 < clusters.size(); ++idx1) {
    for (size_t idx2 = idx1 + 1; idx2 < clusters.size(); ++idx2) {
      CompareAndPushToQueue(out, cluster_size, clusters[idx1], clusters[idx2],
                            &pairs);
    }
  }

  while (clusters.size() > min_cluster_size) {
    if (pairs[0].cost_diff >= cost_diff_threshold) {
      cost_diff_threshold = 1e99;
      min_cluster_size = max_clusters;
      continue;
    }
    // Take the best pair from the top of heap.
    uint32_t best_idx1 = pairs[0].idx1;
    uint32_t best_idx2 = pairs[0].idx2;
    out[best_idx1].AddHistogram(out[best_idx2]);
    out[best_idx1].bit_cost_ = pairs[0].cost_combo;
    cluster_size[best_idx1] += cluster_size[best_idx2];
    for (size_t i = 0; i < symbols_size; ++i) {
      if (symbols[i] == best_idx2) {
        symbols[i] = best_idx1;
      }
    }
    for (std::vector<uint32_t>::iterator cluster = clusters.begin();
         cluster != clusters.end(); ++cluster) {
      if (*cluster >= best_idx2) {
        clusters.erase(cluster);
        break;
      }
    }

    // Remove pairs intersecting the just combined best pair.
    size_t copy_to_idx = 0;
    for (size_t i = 0; i < pairs.size(); ++i) {
      HistogramPair& p = pairs[i];
      if (p.idx1 == best_idx1 || p.idx2 == best_idx1 ||
          p.idx1 == best_idx2 || p.idx2 == best_idx2) {
        // Remove invalid pair from the queue.
        continue;
      }
      if (pairs.front() < p) {
        // Replace the top of the queue if needed.
        HistogramPair front = pairs.front();
        pairs.front() = p;
        pairs[copy_to_idx] = front;
      } else {
        pairs[copy_to_idx] = p;
      }
      ++copy_to_idx;
    }
    pairs.resize(copy_to_idx);

    // Push new pairs formed with the combined histogram to the heap.
    for (size_t i = 0; i < clusters.size(); ++i) {
      CompareAndPushToQueue(out, cluster_size, best_idx1, clusters[i], &pairs);
    }
  }
}